

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_layout_helper.cc
# Opt level: O3

array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>
* google::protobuf::compiler::cpp::MessageLayoutHelper::ConsolidateAlignedFieldGroups
            (array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>
             *__return_storage_ptr__,
            array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>
            *field_groups,size_t alignment,size_t target_alignment)

{
  __normal_iterator<google::protobuf::compiler::cpp::FieldGroup_*,_std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>_>
  __seed;
  FieldGroup *pFVar1;
  ulong uVar2;
  long lVar3;
  undefined8 extraout_RAX;
  long lVar4;
  long unaff_RBX;
  size_t j;
  ulong uVar5;
  long *plVar6;
  ulong uVar7;
  FieldGroup field_group;
  FieldGroup local_78;
  size_type local_50;
  array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>
  *local_48;
  long local_40;
  vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
  *local_38;
  
  local_48 = field_groups;
  if (alignment < target_alignment) {
    uVar2 = target_alignment / alignment;
    if (target_alignment % alignment == 0) {
      lVar3 = 0;
      memset(__return_storage_ptr__,0,0x90);
      local_50 = (uVar2 + 5) / uVar2;
      do {
        local_38 = (vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
                    *)(&__return_storage_ptr__->field_0x0 + lVar3 * 0x18);
        local_40 = lVar3;
        std::
        vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
        ::reserve(local_38,local_50);
        plVar6 = (long *)(&local_48->field_0x0 + lVar3 * 0x18);
        __seed._M_current = (FieldGroup *)*plVar6;
        pFVar1 = (FieldGroup *)plVar6[1];
        if (__seed._M_current != pFVar1) {
          lVar3 = (long)pFVar1 - (long)__seed._M_current >> 5;
          std::
          _Temporary_buffer<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cpp::FieldGroup_*,_std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>_>,_google::protobuf::compiler::cpp::FieldGroup>
          ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cpp::FieldGroup_*,_std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>_>,_google::protobuf::compiler::cpp::FieldGroup>
                               *)&local_78,__seed,(lVar3 - (lVar3 + 1 >> 0x3f)) + 1 >> 1);
          if (local_78.fields_.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
            std::
            __inplace_stable_sort<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cpp::FieldGroup*,std::vector<google::protobuf::compiler::cpp::FieldGroup,std::allocator<google::protobuf::compiler::cpp::FieldGroup>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (__seed._M_current,pFVar1);
          }
          else {
            std::
            __stable_sort_adaptive<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cpp::FieldGroup*,std::vector<google::protobuf::compiler::cpp::FieldGroup,std::allocator<google::protobuf::compiler::cpp::FieldGroup>>>,google::protobuf::compiler::cpp::FieldGroup*,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (__seed._M_current,pFVar1,
                       local_78.fields_.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       local_78.fields_.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
          }
          std::
          _Temporary_buffer<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cpp::FieldGroup_*,_std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>_>,_google::protobuf::compiler::cpp::FieldGroup>
          ::~_Temporary_buffer
                    ((_Temporary_buffer<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cpp::FieldGroup_*,_std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>_>,_google::protobuf::compiler::cpp::FieldGroup>
                      *)&local_78);
          lVar3 = *plVar6;
          lVar4 = plVar6[1];
          if (lVar4 != lVar3) {
            uVar5 = 0;
            do {
              local_78.fields_.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_78.preferred_location_ = 0.0;
              local_78.estimated_memory_size_ = 0;
              local_78.fields_.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_78.fields_.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              uVar7 = uVar2 + uVar5;
              if (uVar5 < uVar7) {
                while (uVar5 < (ulong)(lVar4 - lVar3 >> 5)) {
                  FieldGroup::UpdatePreferredLocationAndInsertOtherFields
                            (&local_78,(FieldGroup *)(uVar5 * 0x20 + lVar3));
                  uVar5 = uVar5 + 1;
                  if (uVar7 <= uVar5) break;
                  lVar3 = *plVar6;
                  lVar4 = plVar6[1];
                }
              }
              std::
              vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
              ::push_back(local_38,&local_78);
              if (local_78.fields_.
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_78.fields_.
                                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_78.fields_.
                                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_78.fields_.
                                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              lVar3 = *plVar6;
              lVar4 = plVar6[1];
              uVar5 = uVar7;
            } while (uVar7 < (ulong)(lVar4 - lVar3 >> 5));
          }
        }
        lVar3 = local_40 + 1;
        if (lVar3 == 6) {
          return __return_storage_ptr__;
        }
      } while( true );
    }
  }
  else {
    ConsolidateAlignedFieldGroups();
  }
  ConsolidateAlignedFieldGroups();
  std::
  _Temporary_buffer<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cpp::FieldGroup_*,_std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>_>,_google::protobuf::compiler::cpp::FieldGroup>
  ::~_Temporary_buffer
            ((_Temporary_buffer<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cpp::FieldGroup_*,_std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>_>,_google::protobuf::compiler::cpp::FieldGroup>
              *)&local_78);
  lVar3 = 0x78;
  do {
    std::
    vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
    ::~vector((vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
               *)(unaff_RBX + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

std::array<std::vector<FieldGroup>, MessageLayoutHelper::kMaxHotness>
MessageLayoutHelper::ConsolidateAlignedFieldGroups(
    std::array<std::vector<FieldGroup>, kMaxHotness>& field_groups,
    size_t alignment, size_t target_alignment) {
  ABSL_CHECK_GT(target_alignment, alignment);
  ABSL_CHECK_EQ(target_alignment % alignment, size_t{0});

  const size_t size_inflation = target_alignment / alignment;
  std::array<std::vector<FieldGroup>, kMaxHotness> partitions_aligned_to_target;

  for (size_t h = 0; h < kMaxHotness; ++h) {
    auto& partition = field_groups[h];
    auto& target_partition = partitions_aligned_to_target[h];
    target_partition.reserve((field_groups.size() + size_inflation - 1) /
                             size_inflation);

    // Using stable_sort ensures that the output is consistent across runs.
    std::stable_sort(partition.begin(), partition.end());

    // Group fields into groups of `size_inflation` fields, which will be
    // aligned to `target_alignment`.
    for (size_t i = 0; i < partition.size(); i += size_inflation) {
      FieldGroup field_group;
      for (size_t j = i; j < partition.size() && j < i + size_inflation; ++j) {
        field_group.Append(partition[j]);
      }
      target_partition.push_back(field_group);
    }
  }

  return partitions_aligned_to_target;
}